

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BOOLEAN __thiscall
BVSparse<Memory::Recycler>::TestAndSet(BVSparse<Memory::Recycler> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVIndex index;
  SparseBVUnit *this_00;
  BOOLEAN bit;
  BVIndex bvIndex;
  SparseBVUnit *bvUnit;
  BVIndex i_local;
  BVSparse<Memory::Recycler> *this_local;
  
  this_00 = BitsFromIndex(this,i,true);
  index = BVUnitT<unsigned_long>::Offset(i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,index);
  BVUnitT<unsigned_long>::Set(this_00,index);
  return BVar1;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndSet(BVIndex i)
{
    SparseBVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(bvIndex);
    bvUnit->Set(bvIndex);
    return bit;
}